

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

void uv__io_init(uv__io_t *w,uv__io_cb cb,int fd)

{
  int fd_local;
  uv__io_cb cb_local;
  uv__io_t *w_local;
  
  if (cb == (uv__io_cb)0x0) {
    __assert_fail("cb != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/core.c"
                  ,0x37e,"void uv__io_init(uv__io_t *, uv__io_cb, int)");
  }
  if (-2 < fd) {
    uv__queue_init(&w->pending_queue);
    uv__queue_init(&w->watcher_queue);
    w->cb = cb;
    w->fd = fd;
    w->events = 0;
    w->pevents = 0;
    return;
  }
  __assert_fail("fd >= -1",
                "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/core.c"
                ,0x37f,"void uv__io_init(uv__io_t *, uv__io_cb, int)");
}

Assistant:

void uv__io_init(uv__io_t* w, uv__io_cb cb, int fd) {
  assert(cb != NULL);
  assert(fd >= -1);
  uv__queue_init(&w->pending_queue);
  uv__queue_init(&w->watcher_queue);
  w->cb = cb;
  w->fd = fd;
  w->events = 0;
  w->pevents = 0;
}